

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O3

void __thiscall test_encode_decode_noise::test_method(test_encode_decode_noise *this)

{
  byte bVar1;
  byte *pbVar2;
  undefined8 extraout_RDX;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar3;
  ulong uVar4;
  pointer ppVar5;
  initializer_list<unsigned_char> __l;
  complex<double> iq;
  bool called;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  default_random_engine g;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  complex_bytes1;
  encoder<signed_char> waver;
  demod_nrz zwave;
  undefined1 local_5f9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5f8;
  result_type local_5e0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_5d8;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  local_5d0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  normal_distribution<double> local_598;
  undefined1 local_578;
  undefined8 local_570;
  shared_count sStack_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  encoder<signed_char> local_520;
  undefined **local_368;
  undefined1 local_360;
  undefined8 *local_358;
  char **local_350;
  demod_nrz local_348;
  
  local_348.fsk_demod.s1._M_value._0_8_ = 0xff0d55aa2233d6d2;
  local_348.fsk_demod.s1._M_value._8_4_ = 0x9f00ff00;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_348;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_5f8,__l,(allocator_type *)&local_520);
  bVar1 = 0xff;
  for (pbVar2 = local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pbVar2 != local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    bVar1 = bVar1 ^ *pbVar2;
  }
  local_348.fsk_demod.s1._M_value[0] = bVar1;
  if (local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_5f8,
               (iterator)
               local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_348);
  }
  else {
    *local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = bVar1;
    local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_5b8._M_unused._M_object = &local_5f9;
  local_5f9 = 0;
  local_5a0 = std::
              _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:124:26)>
              ::_M_invoke;
  local_5a8 = std::
              _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:124:26)>
              ::_M_manager;
  local_5b8._8_8_ = &local_5f8;
  wavingz::demod::demod_nrz::demod_nrz
            (&local_348,0x1f4000,(function<void_(unsigned_char_*,_unsigned_char_*)> *)&local_5b8);
  if (local_5a8 != (code *)0x0) {
    (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
  }
  wavingz::encoder<signed_char>::encoder(&local_520,2000000,40000,100.0);
  wavingz::encoder<signed_char>::operator()
            (&local_5d0,&local_520,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,0.1);
  local_5d8._M_x = 1;
  local_598._M_param._M_mean = 0.0;
  local_598._M_param._M_stddev = 1.0;
  local_598._M_saved = 0.0;
  local_598._M_saved_available = false;
  if (local_5d0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_5d0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_5d0.
             super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_5e0 = std::normal_distribution<double>::operator()
                            (&local_598,&local_5d8,&local_598._M_param);
      plVar3 = &local_5d8;
      std::normal_distribution<double>::operator()(&local_598,&local_5d8,&local_598._M_param);
      iq._M_value._8_8_ = extraout_RDX;
      iq._M_value._0_8_ = plVar3;
      wavingz::demod::demod_nrz::operator()(&local_348,iq);
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_5d0.
                       super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_530,0x8f);
  local_578 = local_5f9;
  local_570 = 0;
  sStack_568.pi_ = (sp_counted_base *)0x0;
  local_350 = &local_550;
  local_550 = "called";
  local_548 = "";
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00113bb8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_558 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_568);
  if (local_5d0.
      super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d0.
                    super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar4 = 0;
  if ((long)local_520.lp2.yv_m.m_end - (long)local_520.lp2.yv_m.m_first >> 3 <=
      (long)local_520.lp2.yv_m.m_size) {
    uVar4 = (ulong)((long)local_520.lp2.yv_m.m_end - (long)local_520.lp2.yv_m.m_buff) >> 3;
  }
  local_520.lp2.yv_m.m_first = local_520.lp2.yv_m.m_first + (local_520.lp2.yv_m.m_size - uVar4);
  if (local_520.lp2.yv_m.m_buff != (pointer)0x0) {
    operator_delete(local_520.lp2.yv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_520.lp2.xv_m.m_end - (long)local_520.lp2.xv_m.m_first >> 3 <=
      (long)local_520.lp2.xv_m.m_size) {
    uVar4 = (ulong)((long)local_520.lp2.xv_m.m_end - (long)local_520.lp2.xv_m.m_buff) >> 3;
  }
  local_520.lp2.xv_m.m_first = local_520.lp2.xv_m.m_first + (local_520.lp2.xv_m.m_size - uVar4);
  if (local_520.lp2.xv_m.m_buff != (pointer)0x0) {
    operator_delete(local_520.lp2.xv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_520.lp1.yv_m.m_end - (long)local_520.lp1.yv_m.m_first >> 3 <=
      (long)local_520.lp1.yv_m.m_size) {
    uVar4 = (ulong)((long)local_520.lp1.yv_m.m_end - (long)local_520.lp1.yv_m.m_buff) >> 3;
  }
  local_520.lp1.yv_m.m_first = local_520.lp1.yv_m.m_first + (local_520.lp1.yv_m.m_size - uVar4);
  if (local_520.lp1.yv_m.m_buff != (pointer)0x0) {
    operator_delete(local_520.lp1.yv_m.m_buff);
  }
  uVar4 = 0;
  if ((long)local_520.lp1.xv_m.m_end - (long)local_520.lp1.xv_m.m_first >> 3 <=
      (long)local_520.lp1.xv_m.m_size) {
    uVar4 = (ulong)((long)local_520.lp1.xv_m.m_end - (long)local_520.lp1.xv_m.m_buff) >> 3;
  }
  local_520.lp1.xv_m.m_first = local_520.lp1.xv_m.m_first + (local_520.lp1.xv_m.m_size - uVar4);
  if (local_520.lp1.xv_m.m_buff != (pointer)0x0) {
    operator_delete(local_520.lp1.xv_m.m_buff);
  }
  wavingz::demod::demod_nrz::~demod_nrz(&local_348);
  if (local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_encode_decode_noise)
{

    std::vector<uint8_t> buffer = { 0xd2, 0xd6, 0x33, 0x22, 0xAA, 0x55, 13, 0xFF, 0x00, 0xFF, 0x00, 0x9f };
    buffer.push_back(wavingz::checksum(buffer.begin(), buffer.end()));

    bool called = false;
    auto wave_callback = [&](uint8_t* begin, uint8_t* end)
    {
        called = true;
        BOOST_CHECK(end-begin >= 13); // we may have some more noisy bytes in the end
        BOOST_CHECK_EQUAL_COLLECTIONS(begin, begin+begin[6], buffer.begin(), buffer.end());
    };

    wavingz::demod::demod_nrz zwave(2048000, wave_callback);
    wavingz::encoder<int8_t> waver(2000000, 40000, 100);
    auto complex_bytes1 = waver(buffer.begin(), buffer.end(), 0.1);

    std::default_random_engine g;
    std::normal_distribution<double> gaussian_noise(0.0, 1.0);

    for(auto pair: complex_bytes1)
    {
        zwave(std::complex<double>(0.1 * gaussian_noise(g) + 0.9 * double(pair.first)/127.0,
                                   0.1 * gaussian_noise(g) + 0.9 * double(pair.second)/127.0));
    }
    BOOST_CHECK(called);
}